

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

CURLcode base64_encode(char *table64,Curl_easy_conflict *data,char *inputbuff,size_t insize,
                      char **outptr,size_t *outlen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char *__s;
  size_t sVar4;
  char *local_78;
  char *indata;
  char *convbuf;
  char *base64data;
  char *output;
  int local_50;
  int inputparts;
  int i;
  undefined1 uStack_44;
  uchar obuf [4];
  uchar ibuf [3];
  CURLcode result;
  size_t *outlen_local;
  char **outptr_local;
  size_t insize_local;
  char *inputbuff_local;
  Curl_easy_conflict *data_local;
  char *table64_local;
  
  *outptr = (char *)0x0;
  *outlen = 0;
  unique0x10000177 = outlen;
  outptr_local = (char **)insize;
  if (insize == 0) {
    outptr_local = (char **)strlen(inputbuff);
  }
  __s = (char *)(*Curl_cmalloc)((ulong)((long)outptr_local << 2) / 3 + 4);
  if (__s == (char *)0x0) {
    table64_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    _uStack_44 = 0;
    local_78 = inputbuff;
    base64data = __s;
    while (outptr_local != (char **)0x0) {
      output._4_4_ = 0;
      for (local_50 = 0; local_50 < 3; local_50 = local_50 + 1) {
        if (outptr_local == (char **)0x0) {
          *(undefined1 *)((long)&i + (long)local_50 + 1) = 0;
        }
        else {
          output._4_4_ = output._4_4_ + 1;
          *(char *)((long)&i + (long)local_50 + 1) = *local_78;
          local_78 = local_78 + 1;
          outptr_local = (char **)((long)outptr_local + -1);
        }
      }
      bVar1 = i._1_1_ >> 2;
      bVar2 = (i._1_1_ & 3) << 4 | i._2_1_ >> 4;
      bVar3 = (i._3_1_ >> 6) + (i._2_1_ & 0xf) * '\x04';
      i._0_1_ = i._3_1_ & 0x3f;
      if (output._4_4_ == 1) {
        curl_msnprintf(base64data,5,"%c%c==",(ulong)(uint)(int)table64[bVar1],
                       (ulong)(uint)(int)table64[bVar2]);
      }
      else if (output._4_4_ == 2) {
        curl_msnprintf(base64data,5,"%c%c%c=",(ulong)(uint)(int)table64[bVar1],
                       (ulong)(uint)(int)table64[bVar2],(ulong)(uint)(int)table64[bVar3]);
      }
      else {
        curl_msnprintf(base64data,5,"%c%c%c%c",(ulong)(uint)(int)table64[bVar1],
                       (ulong)(uint)(int)table64[bVar2],(ulong)(uint)(int)table64[bVar3],
                       (int)table64[(byte)i]);
      }
      base64data = base64data + 4;
    }
    *base64data = '\0';
    *outptr = __s;
    (*Curl_cfree)((void *)0x0);
    sVar4 = strlen(__s);
    *stack0xffffffffffffffc0 = sVar4;
    table64_local._4_4_ = CURLE_OK;
  }
  return table64_local._4_4_;
}

Assistant:

static CURLcode base64_encode(const char *table64,
                              struct Curl_easy *data,
                              const char *inputbuff, size_t insize,
                              char **outptr, size_t *outlen)
{
  CURLcode result;
  unsigned char ibuf[3];
  unsigned char obuf[4];
  int i;
  int inputparts;
  char *output;
  char *base64data;
  char *convbuf = NULL;

  const char *indata = inputbuff;

  *outptr = NULL;
  *outlen = 0;

  if(!insize)
    insize = strlen(indata);

#if SIZEOF_SIZE_T == 4
  if(insize > UINT_MAX/4)
    return CURLE_OUT_OF_MEMORY;
#endif

  base64data = output = malloc(insize * 4 / 3 + 4);
  if(!output)
    return CURLE_OUT_OF_MEMORY;

  /*
   * The base64 data needs to be created using the network encoding
   * not the host encoding.  And we can't change the actual input
   * so we copy it to a buffer, translate it, and use that instead.
   */
  result = Curl_convert_clone(data, indata, insize, &convbuf);
  if(result) {
    free(output);
    return result;
  }

  if(convbuf)
    indata = (char *)convbuf;

  while(insize > 0) {
    for(i = inputparts = 0; i < 3; i++) {
      if(insize > 0) {
        inputparts++;
        ibuf[i] = (unsigned char) *indata;
        indata++;
        insize--;
      }
      else
        ibuf[i] = 0;
    }

    obuf[0] = (unsigned char)  ((ibuf[0] & 0xFC) >> 2);
    obuf[1] = (unsigned char) (((ibuf[0] & 0x03) << 4) | \
                               ((ibuf[1] & 0xF0) >> 4));
    obuf[2] = (unsigned char) (((ibuf[1] & 0x0F) << 2) | \
                               ((ibuf[2] & 0xC0) >> 6));
    obuf[3] = (unsigned char)   (ibuf[2] & 0x3F);

    switch(inputparts) {
    case 1: /* only one byte read */
      snprintf(output, 5, "%c%c==",
               table64[obuf[0]],
               table64[obuf[1]]);
      break;

    case 2: /* two bytes read */
      snprintf(output, 5, "%c%c%c=",
               table64[obuf[0]],
               table64[obuf[1]],
               table64[obuf[2]]);
      break;

    default:
      snprintf(output, 5, "%c%c%c%c",
               table64[obuf[0]],
               table64[obuf[1]],
               table64[obuf[2]],
               table64[obuf[3]]);
      break;
    }
    output += 4;
  }

  /* Zero terminate */
  *output = '\0';

  /* Return the pointer to the new data (allocated memory) */
  *outptr = base64data;

  free(convbuf);

  /* Return the length of the new data */
  *outlen = strlen(base64data);

  return CURLE_OK;
}